

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O1

_Bool effect_handler_AIR_SMITE(effect_handler_context_t *context)

{
  loc grid_00;
  _Bool _Var1;
  wchar_t dam;
  uint32_t uVar2;
  monster *pmVar3;
  uint uVar4;
  ulong uVar5;
  wchar_t typ;
  int iVar6;
  source sVar7;
  loc grid;
  
  dam = effect_calculate_value((effect_handler_context_t_conflict *)context,true);
  grid = (loc)loc(0,0);
  context->ident = true;
  msg("The powers of Air rain down destruction!");
  iVar6 = 0;
  do {
    uVar2 = Rand_div(3);
    uVar4 = 0;
    do {
      grid_00.x = (player->grid).x;
      grid_00.y = (player->grid).y;
      scatter(cave,&grid,grid_00,uVar2 + L'\x01',true);
      _Var1 = loc_eq((loc_conflict)grid,player->grid);
      if ((_Var1) || (_Var1 = square_ispassable(cave,grid), !_Var1)) {
        if (0x12 < uVar4) goto LAB_0013ab71;
      }
      else {
        pmVar3 = square_monster(cave,grid);
        if ((pmVar3 != (monster *)0x0) || (3 < uVar4)) goto LAB_0013ab71;
      }
      uVar4 = uVar4 + 1;
      uVar2 = Rand_div(3);
    } while (uVar4 != 0x13);
    grid.x = (player->grid).x;
    grid.y = (player->grid).y;
LAB_0013ab71:
    uVar2 = Rand_div(3);
    if (uVar2 == 0) {
      sVar7 = source_player();
      uVar5 = (ulong)sVar7.what;
      typ = L'\x0f';
    }
    else {
      uVar2 = Rand_div(2);
      sVar7 = source_player();
      uVar5 = (ulong)sVar7.what;
      if (uVar2 == 0) {
        typ = L'\x05';
      }
      else {
        typ = L'\x01';
      }
    }
    sVar7._0_8_ = uVar5;
    project(sVar7,L'\x01',grid,dam,typ,L'y',L'\0','\0',(object *)0x0);
    event_signal_pause(EVENT_PAUSE,L'\n');
    iVar6 = iVar6 + 1;
    if (iVar6 == 8) {
      return true;
    }
  } while( true );
}

Assistant:

bool effect_handler_AIR_SMITE(effect_handler_context_t *context)
{
	int dam = effect_calculate_value(context, true);
	int i, j;
	struct loc grid = loc(0, 0);
	int flg = PROJECT_STOP | PROJECT_GRID | PROJECT_ITEM | PROJECT_KILL |
		PROJECT_JUMP;

	context->ident = true;

	/* Due warning. */
	msg("The powers of Air rain down destruction!");

	/* Multiple gravity, light, and electricity balls. */
	for (i = 0; i < 8; i++) {
		/* First, we find the spot. */
		for (j = 0; j < 20; j++) {
			/* Pick a (short) distance. */
			int d = randint1(3);

			/* Admit failure.  Switch to Plan B. */
			if (j == 19) {
				grid = player->grid;
				break;
			}

			/* Pick a location */
			scatter(cave, &grid, player->grid, d, true);

			/* Not on top of the player. */
			if (loc_eq(grid, player->grid)) continue;

			/* Require passable terrain */
			if (!square_ispassable(cave, grid)) continue;

			/* Slight preference for actual monsters. */
			if (square_monster(cave, grid)) {
				break;
			} else if (j > 3) {
				/* Will accept any passable grid after a few tries. */
				break;
			}
		}

		/* Choice of 3 */
		if (one_in_(3)) {
			project(source_player(), 1, grid, dam, PROJ_GRAVITY, flg, 0, 0,
					NULL);
		} else if (one_in_(2)) {
			project(source_player(), 1, grid, dam, PROJ_LIGHT, flg, 0, 0, NULL);
		} else {
			project(source_player(), 1, grid, dam, PROJ_ELEC, flg, 0, 0, NULL);
		}

		/* This is a bombardment.  Make it look like one. */
		event_signal_pause(EVENT_PAUSE, 10);
	}
	return true;
}